

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

FBlockNode * FBlockNode::Create(AActor *who,int x,int y,int group)

{
  FBlockNode *pFVar1;
  
  if (FreeBlocks == (FBlockNode *)0x0) {
    pFVar1 = (FBlockNode *)operator_new(0x30);
  }
  else {
    pFVar1 = FreeBlocks;
    FreeBlocks = FreeBlocks->NextBlock;
  }
  pFVar1->BlockIndex = y * bmapwidth + x;
  pFVar1->Me = who;
  pFVar1->PrevActor = (FBlockNode **)0x0;
  pFVar1->NextActor = (FBlockNode *)0x0;
  pFVar1->PrevBlock = (FBlockNode **)0x0;
  pFVar1->NextBlock = (FBlockNode *)0x0;
  return pFVar1;
}

Assistant:

FBlockNode *FBlockNode::Create (AActor *who, int x, int y, int group)
{
	FBlockNode *block;

	if (FreeBlocks != NULL)
	{
		block = FreeBlocks;
		FreeBlocks = block->NextBlock;
	}
	else
	{
		block = new FBlockNode;
	}
	block->BlockIndex = x + y*bmapwidth;
	block->Me = who;
	block->NextActor = NULL;
	block->PrevActor = NULL;
	block->PrevBlock = NULL;
	block->NextBlock = NULL;
	return block;
}